

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

UBool unorm2_isNormalized_63(UNormalizer2 *norm2,UChar *s,int32_t length,UErrorCode *pErrorCode)

{
  UBool UVar1;
  ConstChar16Ptr local_78;
  undefined1 local_70 [8];
  UnicodeString sString;
  UErrorCode *pErrorCode_local;
  int32_t length_local;
  UChar *s_local;
  UNormalizer2 *norm2_local;
  
  sString.fUnion._48_8_ = pErrorCode;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (((s == (UChar *)0x0) && (length != 0)) || (length < -1)) {
      *(undefined4 *)sString.fUnion._48_8_ = 1;
      norm2_local._7_1_ = '\0';
    }
    else {
      icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_78,s);
      icu_63::UnicodeString::UnicodeString
                ((UnicodeString *)local_70,(byte)((uint)length >> 0x1f),&local_78,length);
      icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_78);
      norm2_local._7_1_ = (**(code **)(*(long *)norm2 + 0x58))(norm2,local_70,sString.fUnion._48_8_)
      ;
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_70);
    }
  }
  else {
    norm2_local._7_1_ = '\0';
  }
  return norm2_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
unorm2_isNormalized(const UNormalizer2 *norm2,
                    const UChar *s, int32_t length,
                    UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if((s==NULL && length!=0) || length<-1) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UnicodeString sString(length<0, s, length);
    return ((const Normalizer2 *)norm2)->isNormalized(sString, *pErrorCode);
}